

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O0

Action __thiscall
psy::C::DeclarationBinder::visitTypeQualifier(DeclarationBinder *this,TypeQualifierSyntax *node)

{
  bool bVar1;
  TypeKind TVar2;
  SyntaxKind SVar3;
  reference ppTVar4;
  Type *this_00;
  ostream *poVar5;
  void *this_01;
  undefined1 local_b8 [24];
  size_t sStack_a0;
  size_t local_98;
  anon_union_2_2_2d0bec1f_for_SyntaxToken_7 aStack_90;
  undefined2 uStack_8e;
  uint uStack_8c;
  anon_union_8_8_afa5da80_for_SyntaxToken_12 local_88;
  undefined1 auStack_68 [8];
  SyntaxToken tyQualTk;
  value_type ty;
  QualifiedType *qualTy;
  TypeQualifierSyntax *node_local;
  DeclarationBinder *this_local;
  
  bVar1 = std::stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>::
          empty(&this->tys_);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,499);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"<empty message>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    return Quit;
  }
  ppTVar4 = std::stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
            ::top(&this->tys_);
  if (*ppTVar4 == (value_type)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,499);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"<empty message>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    return Quit;
  }
  ppTVar4 = std::stack<psy::C::Type_*,_std::deque<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>_>
            ::top(&this->tys_);
  tyQualTk.field_10.lexeme_ = (Lexeme *)*ppTVar4;
  TVar2 = Type::kind((Type *)tyQualTk.field_10.lexeme_);
  if (TVar2 == Qualified) {
    ty = (value_type)(**(code **)(*(long *)tyQualTk.field_10.lexeme_ + 0x80))();
  }
  else {
    ty = &makeType<psy::C::QualifiedType,psy::C::Type*>(this,(Type *)tyQualTk.field_10.lexeme_)->
          super_Type;
    popType(this);
    pushType(this,ty);
  }
  if (ty == (value_type)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1ff);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"<empty message>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    return Quit;
  }
  TypeQualifierSyntax::qualifierKeyword((SyntaxToken *)auStack_68,node);
  SVar3 = SyntaxToken::kind((SyntaxToken *)auStack_68);
  if (SVar3 == KeywordAlias___const) {
    QualifiedType::qualifyWithConst((QualifiedType *)ty);
  }
  else if (SVar3 == KeywordAlias___restrict) {
    this_00 = QualifiedType::unqualifiedType((QualifiedType *)ty);
    TVar2 = Type::kind(this_00);
    if (TVar2 == Pointer) {
      QualifiedType::qualifyWithRestrict((QualifiedType *)ty);
    }
    else {
      local_88 = (anon_union_8_8_afa5da80_for_SyntaxToken_12)tyQualTk._40_8_;
      local_98 = tyQualTk.matchingBracket_;
      aStack_90 = tyQualTk.field_7;
      uStack_8e = tyQualTk._34_2_;
      uStack_8c = tyQualTk.lineno_;
      local_b8._16_2_ = tyQualTk.syntaxK_;
      local_b8._18_2_ = tyQualTk.byteSize_;
      local_b8._20_2_ = tyQualTk.charSize_;
      local_b8._22_2_ = tyQualTk._14_2_;
      sStack_a0._0_4_ = tyQualTk.byteOffset_;
      sStack_a0._4_4_ = tyQualTk.charOffset_;
      local_b8._0_8_ = auStack_68;
      local_b8._8_8_ = tyQualTk.tree_;
      DiagnosticsReporter::InvalidUseOfRestrict(&this->diagReporter_,(SyntaxToken *)local_b8);
      SyntaxToken::~SyntaxToken((SyntaxToken *)local_b8);
    }
  }
  else if (SVar3 == ENDof_KeywordOrPunctuatorToken) {
    QualifiedType::qualifyWithVolatile((QualifiedType *)ty);
  }
  else {
    if (SVar3 != Keyword__Atomic) {
      poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      this_01 = (void *)std::ostream::operator<<(poVar5,0x217);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = Quit;
      goto LAB_00451087;
    }
    QualifiedType::qualifyWithAtomic((QualifiedType *)ty);
  }
  this_local._7_1_ = Skip;
LAB_00451087:
  SyntaxToken::~SyntaxToken((SyntaxToken *)auStack_68);
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitTypeQualifier(const TypeQualifierSyntax* node)
{
    QualifiedType* qualTy = nullptr;
    TY_AT_TOP(auto ty, Action::Quit);
    switch (ty->kind()) {
        case TypeKind::Qualified:
            qualTy = ty->asQualifiedType();
            break;

        default:
            qualTy = makeType<QualifiedType>(ty);
            popType();
            pushType(qualTy);
            break;
    }
    PSY_ASSERT_2(qualTy, return Action::Quit);

    const auto tyQualTk = node->qualifierKeyword();
    switch (tyQualTk.kind()) {
        case SyntaxKind::Keyword_const:
            qualTy->qualifyWithConst();
            break;

        case SyntaxKind::Keyword_volatile:
            qualTy->qualifyWithVolatile();
            break;

        case SyntaxKind::Keyword_restrict:
            if (qualTy->unqualifiedType()->kind() == TypeKind::Pointer)
                qualTy->qualifyWithRestrict();
            else
                diagReporter_.InvalidUseOfRestrict(tyQualTk);
            break;

        case SyntaxKind::Keyword__Atomic:
            qualTy->qualifyWithAtomic();
            break;

        default:
            PSY_ASSERT_FAIL_1(return Action::Quit);
    }

    return Action::Skip;
}